

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::IsInfiniteFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  long in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_839;
  allocator local_838 [24];
  code *local_820 [2];
  code *local_810;
  code *local_808;
  code *local_800 [2];
  code *local_7f0;
  code *local_7e8;
  code *local_7e0 [2];
  code *local_7d0;
  code *local_7c8;
  code *local_7c0 [2];
  code *local_7b0;
  code *local_7a8;
  code *local_7a0 [2];
  code *local_790;
  code *local_788;
  LogicalType local_780 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_768;
  LogicalType local_750 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_738;
  LogicalType local_720 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_708;
  LogicalType local_6f0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6d8;
  LogicalType local_6c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6a8;
  LogicalType local_690 [24];
  LogicalType local_678 [24];
  LogicalType local_660 [24];
  LogicalType local_648 [24];
  LogicalType local_630 [24];
  string local_618 [32];
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  std::__cxx11::string::string(local_618,"isinf",local_838);
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_618);
  duckdb::LogicalType::LogicalType((LogicalType *)local_838,FLOAT);
  __l._M_len = 1;
  __l._M_array = (iterator)local_838;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6a8,__l,&local_839);
  duckdb::LogicalType::LogicalType(local_6c0,BOOLEAN);
  local_7a0[1] = (code *)0x0;
  local_7a0[0] = ScalarFunction::UnaryFunction<float,bool,duckdb::IsInfiniteOperator>;
  local_788 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_790 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_630,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_6a8,local_6c0,local_7a0,0,0,0,0,local_630,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_630);
  std::_Function_base::~_Function_base((_Function_base *)local_7a0);
  duckdb::LogicalType::~LogicalType(local_6c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6a8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_838);
  duckdb::LogicalType::LogicalType((LogicalType *)local_838,DOUBLE);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_838;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6d8,__l_00,&local_839);
  duckdb::LogicalType::LogicalType(local_6f0,BOOLEAN);
  local_7c0[1] = (code *)0x0;
  local_7c0[0] = ScalarFunction::UnaryFunction<double,bool,duckdb::IsInfiniteOperator>;
  local_7a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_648,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_6d8,local_6f0,local_7c0,0,0,0,0,local_648,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_648);
  std::_Function_base::~_Function_base((_Function_base *)local_7c0);
  duckdb::LogicalType::~LogicalType(local_6f0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6d8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_838);
  duckdb::LogicalType::LogicalType((LogicalType *)local_838,DATE);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_838;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_708,__l_01,&local_839);
  duckdb::LogicalType::LogicalType(local_720,BOOLEAN);
  local_7e0[1] = (code *)0x0;
  local_7e0[0] = ScalarFunction::UnaryFunction<duckdb::date_t,bool,duckdb::IsInfiniteOperator>;
  local_7c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_660,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_708,local_720,local_7e0,0,0,0,0,local_660,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  duckdb::LogicalType::~LogicalType(local_660);
  std::_Function_base::~_Function_base((_Function_base *)local_7e0);
  duckdb::LogicalType::~LogicalType(local_720);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_708);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_838);
  duckdb::LogicalType::LogicalType((LogicalType *)local_838,TIMESTAMP);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_838;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_738,__l_02,&local_839);
  duckdb::LogicalType::LogicalType(local_750,BOOLEAN);
  local_800[1] = (code *)0x0;
  local_800[0] = ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsInfiniteOperator>;
  local_7e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_678,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4d0,&local_738,local_750,local_800,0,0,0,0,local_678,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  duckdb::LogicalType::~LogicalType(local_678);
  std::_Function_base::~_Function_base((_Function_base *)local_800);
  duckdb::LogicalType::~LogicalType(local_750);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_738);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_838);
  duckdb::LogicalType::LogicalType((LogicalType *)local_838,TIMESTAMP_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_838;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_768,__l_03,&local_839);
  duckdb::LogicalType::LogicalType(local_780,BOOLEAN);
  local_820[1] = (code *)0x0;
  local_820[0] = ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsInfiniteOperator>;
  local_808 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_810 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_690,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f8,&local_768,local_780,local_820,0,0,0,0,local_690,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  duckdb::LogicalType::~LogicalType(local_690);
  std::_Function_base::~_Function_base((_Function_base *)local_820);
  duckdb::LogicalType::~LogicalType(local_780);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_768);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_838);
  return;
}

Assistant:

ScalarFunctionSet IsInfiniteFun::GetFunctions() {
	ScalarFunctionSet funcs("isinf");
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<date_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	return funcs;
}